

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

void __thiscall
Js::CustomExternalWrapperType::CustomExternalWrapperType
          (CustomExternalWrapperType *this,ScriptContext *scriptContext,
          JsTraceCallback traceCallback,JsFinalizeCallback finalizeCallback,
          RecyclableObject *prototype)

{
  Type *pTVar1;
  DynamicTypeHandler *typeHandler;
  Recycler *alloc;
  Type p_Var2;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._32_8_ = finalizeCallback;
  typeHandler = (DynamicTypeHandler *)
                PathTypeHandlerNoAttr::New
                          (scriptContext,
                           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->rootPath).
                           ptr,0,0,0,true,true,(DynamicType *)0x0);
  DynamicType::DynamicType
            (&this->super_DynamicType,scriptContext,TypeIds_Object,prototype,(JavascriptMethod)0x0,
             typeHandler,true,true);
  this->jsTraceCallback = traceCallback;
  this->jsFinalizeCallback = (Type)data._32_8_;
  local_60 = (undefined1  [8])&_JsGetterSetterInterceptor::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_6088375;
  data.filename._0_4_ = 0x19;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
  p_Var2 = (Type)new<Memory::Recycler>(0x48,alloc,0x51e21e);
  (p_Var2->getTrap).ptr = (void *)0x0;
  (p_Var2->setTrap).ptr = (void *)0x0;
  (p_Var2->deletePropertyTrap).ptr = (void *)0x0;
  (p_Var2->enumerateTrap).ptr = (void *)0x0;
  (p_Var2->ownKeysTrap).ptr = (void *)0x0;
  (p_Var2->hasTrap).ptr = (void *)0x0;
  (p_Var2->getOwnPropertyDescriptorTrap).ptr = (void *)0x0;
  (p_Var2->definePropertyTrap).ptr = (void *)0x0;
  (p_Var2->initializeTrap).ptr = (void *)0x0;
  this->jsGetterSetterInterceptor = p_Var2;
  pTVar1 = &(this->super_DynamicType).super_Type.flags;
  *pTVar1 = *pTVar1 | TypeFlagMask_JsrtExternal;
  return;
}

Assistant:

CustomExternalWrapperType::CustomExternalWrapperType(Js::ScriptContext* scriptContext, JsTraceCallback traceCallback, JsFinalizeCallback finalizeCallback, Js::RecyclableObject * prototype)
    : Js::DynamicType(
        scriptContext,
        Js::TypeIds_Object,
        prototype,
        nullptr,
        Js::PathTypeHandlerNoAttr::New(scriptContext, scriptContext->GetLibrary()->GetRootPath(), 0, 0, 0, true, true),
        true,
        true)
    , jsTraceCallback(traceCallback)
    , jsFinalizeCallback(finalizeCallback)
{
    this->jsGetterSetterInterceptor = RecyclerNewStructZ(scriptContext->GetRecycler(), JsGetterSetterInterceptor);
    this->flags |= TypeFlagMask_JsrtExternal;
}